

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_unref_in_prepare_cb(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long *plVar4;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_a;
  uv_prepare_t h;
  undefined1 auStack_198 [120];
  code *pcStack_120;
  long lStack_110;
  long lStack_108;
  undefined1 auStack_100 [120];
  code *pcStack_88;
  code *pcStack_80;
  long local_70;
  long local_68;
  undefined1 local_60 [88];
  
  pcStack_80 = (code *)0x1b8dd8;
  uVar2 = uv_default_loop();
  pcStack_80 = (code *)0x1b8de8;
  uv_prepare_init(uVar2,local_60);
  pcStack_80 = (code *)0x1b8df7;
  uv_prepare_start(local_60,prepare_cb);
  pcStack_80 = (code *)0x1b8dfc;
  uVar2 = uv_default_loop();
  pcStack_80 = (code *)0x1b8e06;
  uv_run(uVar2,0);
  pcStack_80 = (code *)0x1b8e0e;
  do_close(local_60);
  pcStack_80 = (code *)0x1b8e13;
  uVar2 = uv_default_loop();
  pcStack_80 = (code *)0x1b8e27;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_80 = (code *)0x1b8e31;
  uv_run(uVar2,0);
  local_68 = 0;
  pcStack_80 = (code *)0x1b8e3f;
  uVar3 = uv_default_loop();
  pcStack_80 = (code *)0x1b8e47;
  iVar1 = uv_loop_close(uVar3);
  local_70 = (long)iVar1;
  if (local_68 == local_70) {
    pcStack_80 = (code *)0x1b8e5f;
    uv_library_shutdown();
    return 0;
  }
  plVar4 = &local_68;
  pcStack_80 = prepare_cb;
  run_test_unref_in_prepare_cb_cold_1();
  if (plVar4 != (long *)0x0) {
    iVar1 = uv_unref();
    return iVar1;
  }
  pcStack_88 = run_test_timer_ref;
  prepare_cb_cold_1();
  pcStack_120 = (code *)0x1b8e92;
  pcStack_88 = (code *)uVar2;
  uVar2 = uv_default_loop();
  pcStack_120 = (code *)0x1b8ea2;
  uv_timer_init(uVar2,auStack_100);
  pcStack_120 = (code *)0x1b8eaa;
  uv_unref(auStack_100);
  pcStack_120 = (code *)0x1b8eaf;
  uVar2 = uv_default_loop();
  pcStack_120 = (code *)0x1b8eb9;
  uv_run(uVar2,0);
  pcStack_120 = (code *)0x1b8ec1;
  do_close(auStack_100);
  pcStack_120 = (code *)0x1b8ec6;
  uVar2 = uv_default_loop();
  pcStack_120 = (code *)0x1b8eda;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_120 = (code *)0x1b8ee4;
  uv_run(uVar2,0);
  lStack_108 = 0;
  pcStack_120 = (code *)0x1b8ef2;
  uVar3 = uv_default_loop();
  pcStack_120 = (code *)0x1b8efa;
  iVar1 = uv_loop_close(uVar3);
  lStack_110 = (long)iVar1;
  if (lStack_108 == lStack_110) {
    pcStack_120 = (code *)0x1b8f12;
    uv_library_shutdown();
    return 0;
  }
  pcStack_120 = run_test_timer_ref2;
  run_test_timer_ref_cold_1();
  pcStack_120 = (code *)uVar2;
  uVar2 = uv_default_loop();
  uv_timer_init(uVar2,auStack_198);
  uv_timer_start(auStack_198,fail_cb,0x2a,0x2a);
  uv_unref(auStack_198);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  do_close(auStack_198);
  uVar2 = uv_default_loop();
  uv_walk(uVar2,close_walk_cb,0);
  uv_run(uVar2,0);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_timer_ref2_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ref.c"
          ,0x39,"fail_cb should not have been called",in_R9,uVar2);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(unref_in_prepare_cb) {
  uv_prepare_t h;
  uv_prepare_init(uv_default_loop(), &h);
  uv_prepare_start(&h, prepare_cb);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}